

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::Expect(Parser *this,int t)

{
  bool bVar1;
  uint in_EDX;
  undefined4 in_register_00000034;
  Parser *this_00;
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Parser *pPStack_18;
  int t_local;
  Parser *this_local;
  CheckedError *ce;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,t);
  pPStack_18 = this_00;
  this_local = this;
  if (in_EDX == (this_00->super_ParserState).token_) {
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
      anon_unknown_0::NoError();
    }
  }
  else {
    (anonymous_namespace)::TokenToString_abi_cxx11_
              (&local_a0,(_anonymous_namespace_ *)(ulong)in_EDX,in_EDX);
    std::operator+(&local_80,"expecting: ",&local_a0);
    std::operator+(&local_60,&local_80," instead got: ");
    TokenToStringId_abi_cxx11_(&local_d0,this_00,(this_00->super_ParserState).token_);
    std::operator+(&local_40,&local_60,&local_d0);
    Error(this,(string *)this_00);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::Expect(int t) {
  if (t != token_) {
    return Error("expecting: " + TokenToString(t) +
                 " instead got: " + TokenToStringId(token_));
  }
  NEXT();
  return NoError();
}